

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O2

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::qstring_trait_t>::skip_spaces
          (lexical_analyzer_t<cfgfile::qstring_trait_t> *this)

{
  char_t ch;
  bool bVar1;
  input_stream_t<cfgfile::qstring_trait_t> *this_00;
  
  this_00 = this->m_stream;
  do {
    bVar1 = input_stream_t<cfgfile::qstring_trait_t>::at_end(this_00);
    if (bVar1) {
      return;
    }
    ch = input_stream_t<cfgfile::qstring_trait_t>::get(this->m_stream);
    bVar1 = is_space_char(this,ch);
    this_00 = this->m_stream;
  } while (bVar1);
  input_stream_t<cfgfile::qstring_trait_t>::put_back(this_00,ch);
  return;
}

Assistant:

void skip_spaces()
	{
		if( m_stream.at_end() )
			return;

		typename Trait::char_t ch = m_stream.get();

		while( is_space_char( ch ) )
		{
			if( m_stream.at_end() )
				return;

			ch = m_stream.get();
		}

		m_stream.put_back( ch );
	}